

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_declaration.c
# Opt level: O3

void parse_declarator_inner(Translation_Data *translation_data,Scope *scope,Denoted_Base *base)

{
  char cVar1;
  char cVar2;
  KEYWORDS KVar3;
  Type *pTVar4;
  char is_volatile;
  
  cVar1 = get_and_check(translation_data,KW_STAR);
  if (cVar1 != '\0') {
    cVar1 = '\0';
    is_volatile = '\0';
    do {
      while( true ) {
        KVar3 = kw_get(translation_data);
        if (KVar3 != KW_CONST) break;
        cVar1 = '\x01';
LAB_00141be2:
        chomp(translation_data);
      }
      if (KVar3 == KW_VOLATILE) {
        is_volatile = '\x01';
        goto LAB_00141be2;
      }
      pTVar4 = get_pointer_type(base->type,cVar1,is_volatile);
      base->type = pTVar4;
      cVar2 = get_and_check(translation_data,KW_STAR);
      cVar1 = '\0';
      is_volatile = '\0';
    } while (cVar2 != '\0');
  }
  parse_direct_declarator(translation_data,scope,base);
  return;
}

Assistant:

void parse_declarator_inner(struct Translation_Data *translation_data,struct Scope *scope,struct Denoted_Base *base)
{
	enum KEYWORDS hold;
	char is_const;
	char is_volatile;
	while(get_and_check(translation_data,KW_STAR))
	{
		is_const=is_volatile=0;
		while(1)
		{
			hold=kw_get(translation_data);
			if(hold==KW_CONST)
			{
				chomp(translation_data);
				is_const=1;
			}else if(hold==KW_VOLATILE)
			{
				chomp(translation_data);
				is_volatile=1;
			}else
			{
				break;
			}
		}
		base->type=(struct Type*)get_pointer_type(base->type,is_const,is_volatile);
	}
	parse_direct_declarator(translation_data,scope,base);

}